

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_start.cpp
# Opt level: O3

bool __thiscall
FTTYStartupScreen::NetLoop
          (FTTYStartupScreen *this,_func_bool_void_ptr *timer_callback,void *userdata)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  char k;
  timeval tv;
  fd_set rfds;
  byte local_c9;
  void *local_c8;
  timeval local_c0;
  fd_set local_b0;
  
  local_c8 = userdata;
  do {
    while( true ) {
      do {
        local_c0.tv_sec = 0;
        local_c0.tv_usec = 500000;
        local_b0.fds_bits[0xf] = 0;
        local_b0.fds_bits[0xd] = 0;
        local_b0.fds_bits[0xe] = 0;
        local_b0.fds_bits[0xb] = 0;
        local_b0.fds_bits[0xc] = 0;
        local_b0.fds_bits[9] = 0;
        local_b0.fds_bits[10] = 0;
        local_b0.fds_bits[7] = 0;
        local_b0.fds_bits[8] = 0;
        local_b0.fds_bits[5] = 0;
        local_b0.fds_bits[6] = 0;
        local_b0.fds_bits[3] = 0;
        local_b0.fds_bits[4] = 0;
        local_b0.fds_bits[1] = 0;
        local_b0.fds_bits[2] = 0;
        local_b0.fds_bits[0] = 1;
        iVar2 = select(1,&local_b0,(fd_set *)0x0,(fd_set *)0x0,&local_c0);
      } while (iVar2 == -1);
      if (iVar2 != 0) break;
      bVar1 = (*timer_callback)(local_c8);
      if (bVar1) {
        fputc(10,_stderr);
LAB_002cb285:
        return iVar2 == 0;
      }
    }
    sVar3 = read(0,&local_c9,1);
  } while ((sVar3 != 1) || ((local_c9 & 0xdf) != 0x51));
  NetLoop();
  goto LAB_002cb285;
}

Assistant:

bool FTTYStartupScreen::NetLoop(bool (*timer_callback)(void *), void *userdata)
{
	fd_set rfds;
	struct timeval tv;
	int retval;
	char k;

	for (;;)
	{
		// Don't flood the network with packets on startup.
		tv.tv_sec = 0;
		tv.tv_usec = 500000;

		FD_ZERO (&rfds);
		FD_SET (STDIN_FILENO, &rfds);

		retval = select (1, &rfds, NULL, NULL, &tv);

		if (retval == -1)
		{
			// Error
		}
		else if (retval == 0)
		{
			if (timer_callback (userdata))
			{
				fputc ('\n', stderr);
				return true;
			}
		}
		else if (read (STDIN_FILENO, &k, 1) == 1)
		{
			// Check input on stdin
			if (k == 'q' || k == 'Q')
			{
				fprintf (stderr, "\nNetwork game synchronization aborted.");
				return false;
			}
		}
	}
}